

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpMessenger.hpp
# Opt level: O0

void __thiscall
ableton::discovery::
UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
::Impl::broadcastState(Impl *this)

{
  bool bVar1;
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog> *this_00;
  NullLog *log;
  NullLog *log_00;
  double __x;
  duration<long,std::ratio<1l,1000l>> *local_a8;
  endpoint local_90;
  int local_74;
  duration<long,_std::ratio<1L,_1000L>_> local_70;
  Impl *local_68;
  int local_5c;
  duration<long,_std::ratio<1L,_1000L>_> local_58;
  rep local_50;
  duration<long,_std::ratio<1L,_1000L>_> local_48;
  type delay;
  duration<long,_std::ratio<1L,_1000000000L>_> local_38;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
  timeSinceLastBroadcast;
  duration<long,std::ratio<1l,1000l>> local_20 [8];
  milliseconds nominalBroadcastPeriod;
  milliseconds minBroadcastPeriod;
  Impl *this_local;
  
  nominalBroadcastPeriod.__r = 0x32;
  timeSinceLastBroadcast.__r._4_4_ =
       (undefined4)((ulong)((uint)this->mTtl * 1000) / (ulong)(long)(int)(uint)this->mTtlRatio);
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            (local_20,(int *)((long)&timeSinceLastBroadcast.__r + 4));
  delay.__r = (rep)ableton::platforms::asio::AsioTimer::now(&this->mTimer);
  local_38.__r = (rep)std::chrono::operator-
                                ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&delay,&this->mLastBroadcastTime);
  local_30.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_38);
  local_48.__r = (rep)std::chrono::operator-(&nominalBroadcastPeriod,&local_30);
  local_5c = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_58,&local_5c);
  bVar1 = std::chrono::operator>(&local_48,&local_58);
  if (bVar1) {
    local_a8 = (duration<long,std::ratio<1l,1000l>> *)&local_48;
  }
  else {
    local_a8 = local_20;
  }
  local_50 = *(rep *)local_a8;
  ableton::platforms::asio::AsioTimer::
  expires_from_now<std::chrono::duration<long,std::ratio<1l,1000l>>>
            (&this->mTimer,(duration<long,_std::ratio<1L,_1000L>_>)local_50);
  local_68 = this;
  ableton::platforms::asio::AsioTimer::
  async_wait<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,512ul>,ableton::link::PeerState,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&>::Impl::broadcastState()::_lambda(std::error_code)_1_>
            (&this->mTimer,(anon_class_8_1_8991fb9c_for_handler)this);
  local_74 = 1;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_70,&local_74);
  bVar1 = std::chrono::operator<(&local_48,&local_70);
  if (bVar1) {
    this_00 = ableton::util::
              Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
              ::operator->(&this->mIo);
    ableton::platforms::asio::
    Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>::log(this_00,__x);
    log_00 = ableton::util::debug(log);
    ableton::util::operator<<(log_00,(char (*) [19])"Broadcasting state");
    multicastEndpoint();
    sendPeerState(this,'\x01',&local_90);
  }
  return;
}

Assistant:

void broadcastState()
    {
      using namespace std::chrono;

      const auto minBroadcastPeriod = milliseconds{50};
      const auto nominalBroadcastPeriod = milliseconds(mTtl * 1000 / mTtlRatio);
      const auto timeSinceLastBroadcast =
        duration_cast<milliseconds>(mTimer.now() - mLastBroadcastTime);

      // The rate is limited to maxBroadcastRate to prevent flooding the network.
      const auto delay = minBroadcastPeriod - timeSinceLastBroadcast;

      // Schedule the next broadcast before we actually send the
      // message so that if sending throws an exception we are still
      // scheduled to try again. We want to keep trying at our
      // interval as long as this instance is alive.
      mTimer.expires_from_now(delay > milliseconds{0} ? delay : nominalBroadcastPeriod);
      mTimer.async_wait([this](const TimerError e) {
        if (!e)
        {
          broadcastState();
        }
      });

      // If we're not delaying, broadcast now
      if (delay < milliseconds{1})
      {
        debug(mIo->log()) << "Broadcasting state";
        sendPeerState(v1::kAlive, multicastEndpoint());
      }
    }